

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeForces.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargeForces::getSelfInteraction
          (FluctuatingChargeForces *this,int atid,RealType charge,RealType *potential,
          RealType *force)

{
  pointer pFVar1;
  RealType RVar2;
  RealType RVar3;
  int iVar4;
  undefined4 uVar5;
  DoublePolynomial *this_00;
  double dVar6;
  DoublePolynomial vself;
  RealType local_60;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_58;
  
  local_60 = charge;
  if (this->initialized_ == false) {
    initialize(this);
  }
  pFVar1 = (this->FQMap).
           super__Vector_base<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
           ._M_impl.super__Vector_impl_data._M_start +
           (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[atid];
  RVar2 = pFVar1->electronegativity;
  iVar4 = pFVar1->slaterN;
  uVar5 = *(undefined4 *)&pFVar1->field_0x14;
  RVar3 = pFVar1->slaterZeta;
  (this->data).hardness = pFVar1->hardness;
  (this->data).electronegativity = RVar2;
  (this->data).slaterN = iVar4;
  *(undefined4 *)&(this->data).field_0x14 = uVar5;
  (this->data).slaterZeta = RVar3;
  (this->data).curvature = pFVar1->curvature;
  this_00 = &(this->data).vself_;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)this_00,
              (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)&pFVar1->vself_);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree(&local_58,
             (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)this_00);
  dVar6 = Polynomial<double>::evaluate((Polynomial<double> *)&local_58,&local_60);
  *potential = dVar6 + *potential;
  dVar6 = Polynomial<double>::evaluateDerivative((Polynomial<double> *)&local_58,&local_60);
  *force = *force - dVar6;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void FluctuatingChargeForces::getSelfInteraction(int atid, RealType charge,
                                                   RealType& potential,
                                                   RealType& force) {
    if (!initialized_) initialize();

    data = FQMap[FQtids[atid]];

    DoublePolynomial vself = data.vself_;
    potential += vself.evaluate(charge);
    force -= vself.evaluateDerivative(charge);

    return;
  }